

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinModulo
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  RuntimeError *__return_storage_ptr__;
  allocator_type *in_RCX;
  double dVar2;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar3;
  allocator<char> local_61;
  undefined8 local_60;
  string local_58;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"modulo",&local_61);
  local_60 = 0x200000002;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_60;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_38,__l,in_RCX);
  validateBuiltinArgs(this,loc,&local_58,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_38);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  dVar2 = pVVar1[1].v.d;
  if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"division by zero.",(allocator<char> *)&local_60);
    Stack::makeError(__return_storage_ptr__,&this->stack,loc,&local_58);
    __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  dVar2 = fmod((pVVar1->v).d,dVar2);
  VVar3 = makeNumberCheck(this,loc,dVar2);
  (this->scratch).t = NUMBER;
  (this->scratch).v = VVar3._0_8_;
  return (AST *)0x0;
}

Assistant:

const AST *builtinModulo(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "modulo", args, {Value::NUMBER, Value::NUMBER});
        double a = args[0].v.d;
        double b = args[1].v.d;
        if (b == 0)
            throw makeError(loc, "division by zero.");
        scratch = makeNumberCheck(loc, std::fmod(a, b));
        return nullptr;
    }